

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

bool __thiscall ImFontAtlas::Build(ImFontAtlas *this)

{
  ImBitVector *this_00;
  uint *puVar1;
  stbtt_uint8 sVar2;
  byte bVar3;
  ImWchar IVar4;
  ushort uVar5;
  uint uVar6;
  ImFont *pIVar7;
  ImFont **ppIVar8;
  stbtt_uint8 *data;
  undefined8 *puVar9;
  ImFontConfig *pIVar10;
  stbrp_node *psVar11;
  stbtt__buf fontdict;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined4 uVar14;
  undefined8 ptr;
  size_t sVar15;
  bool bVar16;
  ushort uVar17;
  short sVar18;
  stbtt_uint32 sVar19;
  stbtt_uint32 sVar20;
  stbtt_uint32 sVar21;
  stbtt_uint32 sVar22;
  stbtt_uint32 sVar23;
  stbtt_uint32 sVar24;
  stbtt_uint32 sVar25;
  uint uVar26;
  int iVar27;
  int iVar28;
  ulong uVar29;
  int *piVar30;
  void *pvVar31;
  void *pvVar32;
  stbrp_context *ptr_00;
  uchar *puVar33;
  long lVar34;
  stbtt__point *points;
  stbtt__edge *p;
  stbtt__buf *scanline;
  stbtt__buf *psVar35;
  undefined1 auVar36 [8];
  undefined8 *puVar37;
  short sVar38;
  int iVar39;
  long lVar40;
  ulong uVar41;
  ImWchar *pIVar42;
  uint *puVar43;
  ulong uVar44;
  stbtt__active_edge *psVar45;
  stbtt__active_edge *psVar46;
  char *__function;
  uint uVar47;
  long lVar48;
  long lVar49;
  size_t sVar50;
  byte *pbVar51;
  uint uVar52;
  ushort *puVar53;
  uchar uVar54;
  ulong uVar55;
  size_t size;
  byte *pbVar56;
  long lVar57;
  ulong uVar58;
  int iVar59;
  ulong uVar60;
  int iVar61;
  uint uVar62;
  stbtt__edge *psVar63;
  byte bVar64;
  stbtt_fontinfo *psVar65;
  stbtt__active_edge *psVar66;
  long lVar67;
  bool bVar68;
  float fVar69;
  float fVar70;
  undefined4 uVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float in_XMM3_Da;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  stbtt__buf sVar80;
  undefined4 in_stack_fffffffffffffb64;
  undefined4 uVar81;
  ImFontConfig *pIVar82;
  void *pvStack_490;
  undefined4 uVar83;
  undefined8 in_stack_fffffffffffffb90;
  float fStack_468;
  int iStack_450;
  stbtt_uint32 sStack_44c;
  void *pvStack_448;
  undefined1 auStack_440 [8];
  undefined1 auStack_438 [16];
  undefined1 auStack_428 [16];
  ulong uStack_410;
  ulong uStack_408;
  int iStack_3fc;
  void *pvStack_3f8;
  stbtt__active_edge *psStack_3f0;
  undefined8 uStack_3e8;
  void *pvStack_3e0;
  stbrp_node *psStack_3d0;
  ulong uStack_3c8;
  undefined8 uStack_3c0;
  float fStack_3b4;
  float fStack_3b0;
  uint uStack_3ac;
  undefined1 auStack_3a8 [16];
  stbtt_fontinfo *psStack_390;
  undefined8 *puStack_388;
  float fStack_380;
  float fStack_37c;
  int iStack_378;
  float fStack_374;
  long lStack_370;
  long lStack_368;
  ulong uStack_360;
  uchar *puStack_358;
  stbtt__point *psStack_350;
  uchar *puStack_348;
  ulong uStack_340;
  ulong uStack_338;
  float *pfStack_330;
  size_t sStack_328;
  float fStack_320;
  float fStack_31c;
  uint uStack_318;
  uint uStack_314;
  int iStack_310;
  int iStack_30c;
  float fStack_308;
  int iStack_304;
  int iStack_300;
  int iStack_2fc;
  undefined1 auStack_2f8 [16];
  stbrp_context *psStack_2e8;
  float *pfStack_2e0;
  float fStack_2d8;
  undefined4 uStack_2d4;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  size_t sStack_2c0;
  ImFontConfig *pIStack_2b8;
  long lStack_2b0;
  short *psStack_2a8;
  long lStack_2a0;
  ulong uStack_298;
  ulong uStack_290;
  long lStack_288;
  size_t sStack_280;
  size_t sStack_278;
  int iStack_270;
  int iStack_26c;
  undefined1 auStack_268 [16];
  stbtt__buf asStack_258 [33];
  float fStack_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  auStack_3a8._8_8_ = auStack_3a8._0_8_;
  if (this->Locked == true) {
    __assert_fail("!Locked && \"Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                  ,0x8c8,"bool ImFontAtlas::Build()");
  }
  if (this->FontBuilderIO != (ImFontBuilderIO *)0x0) {
    bVar16 = (*this->FontBuilderIO->FontBuilder_Build)(this);
    return bVar16;
  }
  ImFontAtlasGetBuilderForStbTruetype::io.FontBuilder_Build = ImFontAtlasBuildWithStbTruetype;
  if ((this->ConfigData).Size < 1) {
    __assert_fail("atlas->ConfigData.Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                  ,0x918,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
  }
  ImFontAtlasBuildInit(this);
  this->TexID = (ImTextureID)0x0;
  this->TexWidth = 0;
  this->TexHeight = 0;
  (this->TexUvScale).x = 0.0;
  (this->TexUvScale).y = 0.0;
  pvStack_490 = (void *)0x0;
  (this->TexUvWhitePixel).x = 0.0;
  (this->TexUvWhitePixel).y = 0.0;
  ClearTexData(this);
  uVar6 = (this->ConfigData).Size;
  lVar40 = (long)(int)uVar6;
  if (0 < lVar40) {
    uVar29 = 8;
    if (8 < (int)uVar6) {
      uVar29 = (ulong)uVar6;
    }
    pvStack_490 = ImGui::MemAlloc(uVar29 * 0x110);
  }
  uVar26 = (this->Fonts).Size;
  lVar67 = (long)(int)uVar26;
  if (lVar67 < 1) {
    pvStack_3f8 = (void *)0x0;
  }
  else {
    uVar29 = 8;
    if (8 < (int)uVar26) {
      uVar29 = (ulong)uVar26;
    }
    pvStack_3f8 = ImGui::MemAlloc(uVar29 << 5);
  }
  sStack_2c0 = lVar40 * 0x110;
  memset(pvStack_490,0,sStack_2c0);
  sStack_328 = lVar67 << 5;
  memset(pvStack_3f8,0,sStack_328);
  uVar26 = (this->ConfigData).Size;
  uVar29 = (ulong)uVar26;
  uVar81 = CONCAT13((int)uVar26 < 1,(int3)in_stack_fffffffffffffb64);
  auStack_3a8._0_8_ = lVar67;
  if (0 < (int)uVar26) {
    uVar41 = 0;
    if (0 < (int)uVar6) {
      uVar41 = (ulong)uVar6;
    }
    auStack_2f8._0_8_ = uVar41;
    lVar57 = 0;
    do {
      if (lVar57 == auStack_2f8._0_8_) {
        __function = "T &ImVector<ImFontBuildSrcData>::operator[](int) [T = ImFontBuildSrcData]";
        goto LAB_00137de4;
      }
      if ((int)uVar29 <= lVar57) goto LAB_00137e4b;
      pIVar82 = (this->ConfigData).Data;
      pIVar7 = pIVar82[lVar57].DstFont;
      if ((pIVar7 == (ImFont *)0x0) ||
         (pIVar7->ContainerAtlas != this && pIVar7->ContainerAtlas != (ImFontAtlas *)0x0)) {
        __assert_fail("cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                      ,0x930,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      *(undefined4 *)((long)pvStack_490 + lVar57 * 0x110 + 0xe0) = 0xffffffff;
      uVar29 = (ulong)(this->Fonts).Size;
      if ((long)uVar29 < 1) {
LAB_00137e9b:
        __assert_fail("src_tmp.DstIndex != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                      ,0x939,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      pIVar82 = pIVar82 + lVar57;
      ppIVar8 = (this->Fonts).Data;
      uVar55 = 0xffffffff;
      uVar41 = 0;
      do {
        if (pIVar7 == ppIVar8[uVar41]) {
          *(int *)((long)pvStack_490 + lVar57 * 0x110 + 0xe0) = (int)uVar41;
          uVar55 = uVar41 & 0xffffffff;
        }
        uVar41 = uVar41 + 1;
      } while ((uVar41 < uVar29) && ((int)uVar55 == -1));
      if ((int)uVar55 == -1) goto LAB_00137e9b;
      uVar71 = (undefined4)lVar57;
      uVar83 = (undefined4)((ulong)lVar57 >> 0x20);
      data = (stbtt_uint8 *)pIVar82->FontData;
      iVar27 = pIVar82->FontNo;
      sVar2 = *data;
      if (((((sVar2 == '1') && (data[1] == '\0')) && (data[2] == '\0')) && (data[3] == '\0')) ||
         (((sVar2 == 't' && (data[1] == 'y')) && ((data[2] == 'p' && (data[3] == '1')))))) {
LAB_00134e21:
        sVar25 = -(uint)(iVar27 != 0);
      }
      else {
        if (sVar2 == '\0') {
          if (((data[1] != '\x01') || (data[2] != '\0')) || (data[3] != '\0')) goto LAB_00134df9;
          goto LAB_00134e21;
        }
        if ((((sVar2 == 'O') && (data[1] == 'T')) && (data[2] == 'T')) && (data[3] == 'O'))
        goto LAB_00134e21;
LAB_00134df9:
        sVar25 = 0xffffffff;
        if (sVar2 == 't') {
          if (data[1] == 't') {
            if ((data[2] == 'c') && (data[3] == 'f')) {
              uVar26 = *(uint *)(data + 4);
              uVar26 = uVar26 >> 0x18 | (uVar26 & 0xff0000) >> 8 | (uVar26 & 0xff00) << 8 |
                       uVar26 << 0x18;
              if (((uVar26 == 0x20000) || (uVar26 == 0x10000)) &&
                 (uVar26 = *(uint *)(data + 8),
                 iVar27 < (int)(uVar26 >> 0x18 | (uVar26 & 0xff0000) >> 8 | (uVar26 & 0xff00) << 8 |
                               uVar26 << 0x18))) {
                uVar26 = *(uint *)(data + (long)iVar27 * 4 + 0xc);
                sVar25 = uVar26 >> 0x18 | (uVar26 & 0xff0000) >> 8 | (uVar26 & 0xff00) << 8 |
                         uVar26 << 0x18;
              }
            }
          }
          else if (((data[1] == 'r') && (data[2] == 'u')) && (data[3] == 'e')) goto LAB_00134e21;
        }
      }
      if ((int)sVar25 < 0) {
        __assert_fail("font_offset >= 0 && \"FontData is incorrect, or FontNo cannot be found.\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                      ,0x93e,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      *(stbtt_uint8 **)((long)pvStack_490 + lVar57 * 0x110 + 8) = data;
      *(stbtt_uint32 *)((long)pvStack_490 + lVar57 * 0x110 + 0x10) = sVar25;
      *(undefined8 *)((long)pvStack_490 + lVar57 * 0x110 + 0x40) = 0;
      *(undefined8 *)((long)pvStack_490 + lVar57 * 0x110 + 0x48) = 0;
      sVar19 = stbtt__find_table(data,sVar25,"cmap");
      sVar20 = stbtt__find_table(data,sVar25,"loca");
      *(stbtt_uint32 *)((long)pvStack_490 + lVar57 * 0x110 + 0x18) = sVar20;
      sVar21 = stbtt__find_table(data,sVar25,"head");
      auStack_428._0_4_ = sVar21;
      *(stbtt_uint32 *)((long)pvStack_490 + lVar57 * 0x110 + 0x1c) = sVar21;
      sVar21 = stbtt__find_table(data,sVar25,"glyf");
      *(stbtt_uint32 *)((long)pvStack_490 + lVar57 * 0x110 + 0x20) = sVar21;
      sVar22 = stbtt__find_table(data,sVar25,"hhea");
      *(stbtt_uint32 *)((long)pvStack_490 + lVar57 * 0x110 + 0x24) = sVar22;
      sVar23 = stbtt__find_table(data,sVar25,"hmtx");
      *(stbtt_uint32 *)((long)pvStack_490 + lVar57 * 0x110 + 0x28) = sVar23;
      sVar24 = stbtt__find_table(data,sVar25,"kern");
      *(stbtt_uint32 *)((long)pvStack_490 + lVar57 * 0x110 + 0x2c) = sVar24;
      sVar24 = stbtt__find_table(data,sVar25,"GPOS");
      *(stbtt_uint32 *)((long)pvStack_490 + lVar57 * 0x110 + 0x30) = sVar24;
      if ((((sVar19 == 0) || ((float)auStack_428._0_4_ == 0.0)) || (sVar22 == 0)) || (sVar23 == 0))
      goto LAB_00137cbd;
      if (sVar21 == 0) {
        uStack_3e8 = CONCAT44(uStack_3e8._4_4_,2);
        auStack_440 = (undefined1  [8])((ulong)auStack_440 & 0xffffffff00000000);
        uStack_3c0._0_4_ = 0;
        sStack_44c = 0;
        sVar21 = stbtt__find_table(data,sVar25,"CFF ");
        if (sVar21 == 0) goto LAB_00137cbd;
        *(undefined8 *)((long)pvStack_490 + lVar57 * 0x110 + 0x90) = 0;
        *(undefined8 *)((long)pvStack_490 + lVar57 * 0x110 + 0x98) = 0;
        *(undefined8 *)((long)pvStack_490 + lVar57 * 0x110 + 0x80) = 0;
        *(undefined8 *)((long)pvStack_490 + lVar57 * 0x110 + 0x88) = 0;
        *(stbtt_uint8 **)((long)pvStack_490 + lVar57 * 0x110 + 0x40) = data + sVar21;
        *(undefined8 *)((long)pvStack_490 + lVar57 * 0x110 + 0x48) = 0x2000000000000000;
        asStack_258[0].data = *(uchar **)((long)pvStack_490 + lVar57 * 0x110 + 0x40);
        asStack_258[0]._8_8_ = *(undefined8 *)((long)pvStack_490 + lVar57 * 0x110 + 0x48);
        if ((long)asStack_258[0].cursor < -2) {
LAB_00137f0d:
          __assert_fail("!(o > b->size || o < 0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imstb_truetype.h"
                        ,0x46c,"void stbtt__buf_seek(stbtt__buf *, int)");
        }
        lVar67 = (long)asStack_258[0].cursor + 2;
        iVar27 = (int)lVar67;
        if (asStack_258[0].size < iVar27) goto LAB_00137f0d;
        uVar26 = 0;
        if (iVar27 < asStack_258[0].size) {
          iVar27 = asStack_258[0].cursor + 3;
          uVar26 = (uint)asStack_258[0].data[lVar67];
        }
        asStack_258[0].cursor = iVar27;
        if (asStack_258[0].size < (int)uVar26) goto LAB_00137f0d;
        asStack_258[0].cursor = uVar26;
        stbtt__cff_get_index(asStack_258);
        sVar80 = stbtt__cff_get_index(asStack_258);
        auStack_438 = (undefined1  [16])stbtt__cff_index_get(sVar80,0);
        stbtt__cff_get_index(asStack_258);
        sVar80 = stbtt__cff_get_index(asStack_258);
        *(stbtt__buf *)((long)pvStack_490 + lVar57 * 0x110 + 0x60) = sVar80;
        stbtt__dict_get_ints((stbtt__buf *)auStack_438,0x11,1,(stbtt_uint32 *)auStack_440);
        stbtt__dict_get_ints((stbtt__buf *)auStack_438,0x106,1,(stbtt_uint32 *)&uStack_3e8);
        stbtt__dict_get_ints((stbtt__buf *)auStack_438,0x124,1,(stbtt_uint32 *)&uStack_3c0);
        stbtt__dict_get_ints((stbtt__buf *)auStack_438,0x125,1,&sStack_44c);
        sVar80.data._4_4_ = uVar81;
        sVar80.data._0_4_ = sVar20;
        sVar80.cursor = (int)pIVar82;
        sVar80.size = (int)((ulong)pIVar82 >> 0x20);
        fontdict.data._4_4_ = uVar83;
        fontdict.data._0_4_ = uVar71;
        fontdict.cursor = (int)in_stack_fffffffffffffb90;
        fontdict.size = (int)((ulong)in_stack_fffffffffffffb90 >> 0x20);
        sVar80 = stbtt__get_subrs(sVar80,fontdict);
        sVar20 = sStack_44c;
        *(stbtt__buf *)((long)pvStack_490 + lVar57 * 0x110 + 0x70) = sVar80;
        if (((stbtt_uint32)uStack_3e8 != 2) || (uVar14 = auStack_440._0_4_, auStack_440._0_4_ == 0))
        goto LAB_00137cbd;
        if ((stbtt_uint32)uStack_3c0 != 0) {
          uVar29 = (ulong)sStack_44c;
          if (uVar29 == 0) goto LAB_00137cbd;
          if (((int)(stbtt_uint32)uStack_3c0 < 0) ||
             (asStack_258[0].size < (int)(stbtt_uint32)uStack_3c0)) goto LAB_00137f0d;
          asStack_258[0].cursor = (stbtt_uint32)uStack_3c0;
          sVar80 = stbtt__cff_get_index(asStack_258);
          *(stbtt__buf *)((long)pvStack_490 + lVar57 * 0x110 + 0x80) = sVar80;
          puVar33 = asStack_258[0].data + uVar29;
          lVar67 = (ulong)(asStack_258[0].size - sVar20) << 0x20;
          if ((int)(asStack_258[0].size - sVar20 | sVar20) < 0 || asStack_258[0].size < (int)sVar20)
          {
            puVar33 = (uchar *)0x0;
            lVar67 = 0;
          }
          *(uchar **)((long)pvStack_490 + lVar57 * 0x110 + 0x90) = puVar33;
          *(long *)((long)pvStack_490 + lVar57 * 0x110 + 0x98) = lVar67;
        }
        if (((int)uVar14 < 0) || (asStack_258[0].size < (int)uVar14)) goto LAB_00137f0d;
        asStack_258[0].cursor = uVar14;
        sVar80 = stbtt__cff_get_index(asStack_258);
        *(stbtt__buf *)((long)pvStack_490 + lVar57 * 0x110 + 0x50) = sVar80;
      }
      else if (sVar20 == 0) goto LAB_00137cbd;
      sVar25 = stbtt__find_table(data,sVar25,"maxp");
      if (sVar25 == 0) {
        uVar26 = 0xffff;
      }
      else {
        uVar26 = (uint)(ushort)(*(ushort *)(data + (ulong)sVar25 + 4) << 8 |
                               *(ushort *)(data + (ulong)sVar25 + 4) >> 8);
      }
      *(uint *)((long)pvStack_490 + lVar57 * 0x110 + 0x14) = uVar26;
      uVar17 = *(ushort *)(data + (ulong)sVar19 + 2) << 8 |
               *(ushort *)(data + (ulong)sVar19 + 2) >> 8;
      *(undefined4 *)((long)pvStack_490 + lVar57 * 0x110 + 0x34) = 0;
      if (uVar17 != 0) {
        uVar26 = sVar19 + 4;
        uVar29 = (ulong)uVar17;
        do {
          uVar17 = *(ushort *)(data + uVar26) << 8 | *(ushort *)(data + uVar26) >> 8;
          if ((uVar17 == 0) ||
             ((uVar17 == 3 &&
              ((uVar17 = *(ushort *)(data + (ulong)uVar26 + 2) << 8 |
                         *(ushort *)(data + (ulong)uVar26 + 2) >> 8, uVar17 == 10 || (uVar17 == 1)))
              ))) {
            uVar52 = *(uint *)(data + (ulong)uVar26 + 4);
            *(uint *)((long)pvStack_490 + lVar57 * 0x110 + 0x34) =
                 (uVar52 >> 0x18 | (uVar52 & 0xff0000) >> 8 | (uVar52 & 0xff00) << 8 |
                 uVar52 << 0x18) + sVar19;
          }
          uVar26 = uVar26 + 8;
          uVar29 = uVar29 - 1;
        } while (uVar29 != 0);
      }
      if (*(int *)((long)pvStack_490 + lVar57 * 0x110 + 0x34) == 0) goto LAB_00137cbd;
      *(uint *)((long)pvStack_490 + lVar57 * 0x110 + 0x38) =
           (uint)(ushort)(*(ushort *)
                           (data + (long)*(int *)((long)pvStack_490 + lVar57 * 0x110 + 0x1c) + 0x32)
                          << 8 | *(ushort *)
                                  (data + (long)*(int *)((long)pvStack_490 + lVar57 * 0x110 + 0x1c)
                                          + 0x32) >> 8);
      iVar27 = *(int *)((long)pvStack_490 + lVar57 * 0x110 + 0xe0);
      if (((long)iVar27 < 0) || (auStack_3a8._0_4_ <= iVar27)) goto LAB_00137e62;
      pIVar42 = pIVar82->GlyphRanges;
      if (pIVar42 == (ImWchar *)0x0) {
        pIVar42 = GetGlyphRangesDefault::ranges;
      }
      *(ImWchar **)((long)pvStack_490 + lVar57 * 0x110 + 0xd8) = pIVar42;
      IVar4 = *pIVar42;
      while (IVar4 != 0) {
        uVar17 = pIVar42[1];
        if (uVar17 == 0) break;
        uVar26 = *(uint *)((long)pvStack_490 + lVar57 * 0x110 + 0xe4);
        uVar52 = (uint)uVar17;
        if ((int)(uint)uVar17 < (int)uVar26) {
          uVar52 = uVar26;
        }
        *(uint *)((long)pvStack_490 + lVar57 * 0x110 + 0xe4) = uVar52;
        IVar4 = pIVar42[2];
        pIVar42 = pIVar42 + 2;
      }
      piVar30 = (int *)((long)iVar27 * 0x20 + (long)pvStack_3f8);
      *piVar30 = *piVar30 + 1;
      iVar27 = *(int *)((long)pvStack_490 + lVar57 * 0x110 + 0xe4);
      if (iVar27 < piVar30[1]) {
        iVar27 = piVar30[1];
      }
      piVar30[1] = iVar27;
      lVar57 = CONCAT44(uVar83,uVar71) + 1;
      uVar29 = (ulong)(this->ConfigData).Size;
      uVar81 = CONCAT13((long)uVar29 <= lVar57,(int3)uVar81);
      lVar67 = auStack_3a8._0_8_;
    } while (lVar57 < (long)uVar29);
  }
  uVar26 = 0;
  if (0 < (int)uVar6) {
    lVar57 = 0;
    uVar26 = 0;
    do {
      iVar27 = *(int *)((long)pvStack_490 + lVar57 * 0x110 + 0xe0);
      lVar49 = (long)iVar27;
      if ((lVar49 < 0) || ((int)lVar67 <= iVar27)) goto LAB_00137e62;
      auStack_428._0_8_ = lVar57;
      psVar65 = (stbtt_fontinfo *)(lVar57 * 0x110 + (long)pvStack_490);
      ImBitVector::Create((ImBitVector *)&psVar65[1].charstrings,
                          *(int *)((long)&psVar65[1].cff.data + 4) + 1);
      pvVar32 = pvStack_3f8;
      this_00 = (ImBitVector *)((long)pvStack_3f8 + lVar49 * 0x20 + 0x10);
      if (*(int *)((long)pvStack_3f8 + lVar49 * 0x20 + 0x10) == 0) {
        ImBitVector::Create(this_00,*(int *)((long)pvStack_3f8 + lVar49 * 0x20 + 4) + 1);
      }
      puVar53 = *(ushort **)&psVar65[1].indexToLocFormat;
      uVar17 = *puVar53;
      for (; (uVar52 = (uint)uVar17, uVar17 != 0 && (puVar53[1] != 0)); puVar53 = puVar53 + 2) {
        if (uVar17 <= puVar53[1]) {
          do {
            bVar16 = ImBitVector::TestBit(this_00,uVar52);
            if ((!bVar16) && (iVar27 = stbtt_FindGlyphIndex(psVar65,uVar52), iVar27 != 0)) {
              piVar30 = &psVar65[1].cff.cursor;
              *piVar30 = *piVar30 + 1;
              piVar30 = (int *)((long)pvVar32 + lVar49 * 0x20 + 8);
              *piVar30 = *piVar30 + 1;
              ImBitVector::SetBit((ImBitVector *)&psVar65[1].charstrings,uVar52);
              ImBitVector::SetBit(this_00,uVar52);
              uVar26 = uVar26 + 1;
            }
            bVar16 = uVar52 < puVar53[1];
            uVar52 = uVar52 + 1;
          } while (bVar16);
        }
        uVar17 = puVar53[2];
      }
      lVar57 = auStack_428._0_8_ + 1;
      lVar67 = auStack_3a8._0_8_;
    } while (lVar57 != lVar40);
  }
  if (0 < (int)uVar6) {
    lVar67 = 0;
    do {
      uVar71 = (undefined4)lVar67;
      uVar83 = (undefined4)((ulong)lVar67 >> 0x20);
      lVar67 = lVar67 * 0x110;
      iVar27 = *(int *)((long)pvStack_490 + lVar67 + 0xe8);
      if (*(int *)((long)pvStack_490 + lVar67 + 0x104) < iVar27) {
        pvVar31 = ImGui::MemAlloc((long)iVar27 << 2);
        pvVar32 = *(void **)((long)pvStack_490 + lVar67 + 0x108);
        if (pvVar32 != (void *)0x0) {
          memcpy(pvVar31,pvVar32,(long)*(int *)((long)pvStack_490 + lVar67 + 0x100) << 2);
          ImGui::MemFree(*(void **)((long)pvStack_490 + lVar67 + 0x108));
        }
        *(void **)((long)pvStack_490 + lVar67 + 0x108) = pvVar31;
        *(int *)((long)pvStack_490 + lVar67 + 0x104) = iVar27;
      }
      lVar57 = (long)*(int *)((long)pvStack_490 + lVar67 + 0xf0);
      if (0 < lVar57) {
        puVar43 = *(uint **)((long)pvStack_490 + lVar67 + 0xf8);
        puVar1 = puVar43 + lVar57;
        iVar27 = 0;
        do {
          auStack_428._0_8_ = puVar43;
          uVar52 = *puVar43;
          if (uVar52 != 0) {
            uVar62 = 0;
            do {
              if ((uVar52 >> (uVar62 & 0x1f) & 1) != 0) {
                iVar61 = *(int *)((long)pvStack_490 + lVar67 + 0x100);
                iVar28 = *(int *)((long)pvStack_490 + lVar67 + 0x104);
                if (iVar61 == iVar28) {
                  if (iVar28 == 0) {
                    iVar39 = 8;
                  }
                  else {
                    iVar39 = iVar28 / 2 + iVar28;
                  }
                  iVar61 = iVar61 + 1;
                  if (iVar61 < iVar39) {
                    iVar61 = iVar39;
                  }
                  if (iVar28 < iVar61) {
                    pvVar31 = ImGui::MemAlloc((long)iVar61 << 2);
                    pvVar32 = *(void **)((long)pvStack_490 + lVar67 + 0x108);
                    if (pvVar32 != (void *)0x0) {
                      memcpy(pvVar31,pvVar32,(long)*(int *)((long)pvStack_490 + lVar67 + 0x100) << 2
                            );
                      ImGui::MemFree(*(void **)((long)pvStack_490 + lVar67 + 0x108));
                    }
                    *(void **)((long)pvStack_490 + lVar67 + 0x108) = pvVar31;
                    *(int *)((long)pvStack_490 + lVar67 + 0x104) = iVar61;
                  }
                }
                *(uint *)(*(long *)((long)pvStack_490 + lVar67 + 0x108) +
                         (long)*(int *)((long)pvStack_490 + lVar67 + 0x100) * 4) = iVar27 + uVar62;
                piVar30 = (int *)((long)pvStack_490 + lVar67 + 0x100);
                *piVar30 = *piVar30 + 1;
              }
              uVar62 = uVar62 + 1;
            } while (uVar62 != 0x20);
          }
          puVar43 = (uint *)(auStack_428._0_8_ + 4);
          iVar27 = iVar27 + 0x20;
        } while (puVar43 < puVar1);
      }
      pvVar32 = *(void **)((long)pvStack_490 + lVar67 + 0xf8);
      if (pvVar32 != (void *)0x0) {
        *(undefined8 *)((long)pvStack_490 + lVar67 + 0xf0) = 0;
        ImGui::MemFree(pvVar32);
        *(undefined8 *)((long)pvStack_490 + lVar67 + 0xf8) = 0;
      }
      if (*(int *)((long)pvStack_490 + lVar67 + 0x100) !=
          *(int *)((long)pvStack_490 + lVar67 + 0xe8)) {
        __assert_fail("src_tmp.GlyphsList.Size == src_tmp.GlyphsCount",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                      ,0x96d,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      lVar67 = CONCAT44(uVar83,uVar71) + 1;
    } while (lVar67 != lVar40);
  }
  sVar15 = sStack_328;
  pvVar32 = pvStack_3f8;
  if (0 < (int)auStack_3a8._0_4_) {
    sVar50 = 0;
    do {
      pvVar31 = *(void **)((long)pvVar32 + sVar50 + 0x18);
      if (pvVar31 != (void *)0x0) {
        *(undefined8 *)((long)pvVar32 + sVar50 + 0x10) = 0;
        ImGui::MemFree(pvVar31);
        *(undefined8 *)((long)pvVar32 + sVar50 + 0x18) = 0;
      }
      sVar50 = sVar50 + 0x20;
    } while (sVar15 != sVar50);
  }
  if (pvStack_3f8 != (void *)0x0) {
    ImGui::MemFree(pvStack_3f8);
    pvStack_3f8 = (void *)0x0;
  }
  auStack_438 = ZEXT816(0);
  uStack_3e8 = 0;
  pvStack_3e0 = (void *)0x0;
  if (0 < (int)uVar26) {
    uVar52 = 8;
    if (7 < (int)uVar26) {
      uVar52 = uVar26;
    }
    if (0 < (int)uVar52) {
      pvVar32 = ImGui::MemAlloc((long)(int)uVar52 << 4);
      if ((void *)auStack_438._8_8_ != (void *)0x0) {
        memcpy(pvVar32,(void *)auStack_438._8_8_,(long)(int)auStack_438._0_4_ << 4);
        ImGui::MemFree((void *)auStack_438._8_8_);
      }
      auVar13._4_8_ = pvVar32;
      auVar13._0_4_ = uVar52;
      auVar13._12_4_ = 0;
      auStack_438 = auVar13 << 0x20;
    }
  }
  auStack_438._0_4_ = uVar26;
  if (uStack_3e8._4_4_ < (int)uVar26) {
    if (uStack_3e8._4_4_ == 0) {
      uVar52 = 8;
    }
    else {
      uVar52 = uStack_3e8._4_4_ / 2 + uStack_3e8._4_4_;
    }
    if ((int)uVar52 <= (int)uVar26) {
      uVar52 = uVar26;
    }
    if (uStack_3e8._4_4_ < (int)uVar52) {
      pvVar32 = ImGui::MemAlloc((long)(int)uVar52 * 0x1c);
      if (pvStack_3e0 != (void *)0x0) {
        memcpy(pvVar32,pvStack_3e0,(long)(int)(stbtt_uint32)uStack_3e8 * 0x1c);
        ImGui::MemFree(pvStack_3e0);
      }
      uStack_3e8 = (ulong)uVar52 << 0x20;
      pvStack_3e0 = pvVar32;
    }
  }
  uStack_3e8 = CONCAT44(uStack_3e8._4_4_,uVar26);
  iVar27 = 0;
  memset((void *)auStack_438._8_8_,0,(long)(int)auStack_438._0_4_ << 4);
  memset(pvStack_3e0,0,(long)(int)(stbtt_uint32)uStack_3e8 * 0x1c);
  fVar69 = 0.0;
  if (0 < (int)uVar6) {
    lVar67 = 0;
    uVar26 = 0;
    uVar52 = 0;
    do {
      iVar61 = *(int *)((long)pvStack_490 + lVar67 * 0x110 + 0xe8);
      if (iVar61 != 0) {
        if (((int)uVar26 < 0) || ((int)auStack_438._0_4_ <= (int)uVar26)) {
          __function = "T &ImVector<stbrp_rect>::operator[](int) [T = stbrp_rect]";
          goto LAB_00137de4;
        }
        psVar65 = (stbtt_fontinfo *)(lVar67 * 0x110 + (long)pvStack_490);
        *(ulong *)&psVar65[1].hmtx = (ulong)uVar26 * 0x10 + auStack_438._8_8_;
        if (((int)uVar52 < 0) || ((int)(stbtt_uint32)uStack_3e8 <= (int)uVar52)) {
          __function = "T &ImVector<stbtt_packedchar>::operator[](int) [T = stbtt_packedchar]";
          goto LAB_00137de4;
        }
        pvVar32 = (void *)((ulong)uVar52 * 0x1c + (long)pvStack_3e0);
        *(void **)&psVar65[1].gpos = pvVar32;
        if ((this->ConfigData).Size <= lVar67) goto LAB_00137e4b;
        pIVar82 = (this->ConfigData).Data;
        fVar69 = pIVar82[lVar67].SizePixels;
        *(float *)&psVar65[1].userdata = fVar69;
        *(undefined4 *)((long)&psVar65[1].userdata + 4) = 0;
        psVar65[1].data = *(uchar **)&psVar65[1].gsubrs.cursor;
        psVar65[1].fontstart = *(int *)&psVar65[1].gsubrs.data;
        *(void **)&psVar65[1].loca = pvVar32;
        *(char *)&psVar65[1].glyf = (char)pIVar82[lVar67].OversampleH;
        *(char *)((long)&psVar65[1].glyf + 1) = (char)pIVar82[lVar67].OversampleV;
        if (fVar69 <= 0.0) {
          fVar69 = -fVar69;
          uVar62 = (uint)(ushort)(*(ushort *)(psVar65->data + (long)psVar65->head + 0x12) << 8 |
                                 *(ushort *)(psVar65->data + (long)psVar65->head + 0x12) >> 8);
        }
        else {
          puVar33 = psVar65->data;
          lVar57 = (long)psVar65->hhea;
          uVar62 = ((int)(short)((ushort)puVar33[lVar57 + 4] << 8) | (uint)puVar33[lVar57 + 5]) -
                   ((int)(short)((ushort)puVar33[lVar57 + 6] << 8) | (uint)puVar33[lVar57 + 7]);
        }
        fVar69 = fVar69 / (float)(int)uVar62;
        uVar26 = uVar26 + iVar61;
        uVar52 = uVar52 + iVar61;
        if (0 < *(int *)&psVar65[1].gsubrs.data) {
          auStack_428._0_8_ = lVar67;
          iVar61 = this->TexGlyphPadding;
          lVar49 = 6;
          lVar57 = 0;
          do {
            if (*(int *)&psVar65[1].gsubrs.data <= lVar57) goto LAB_00137dcf;
            iVar28 = stbtt_FindGlyphIndex
                               (psVar65,*(int *)(*(long *)&psVar65[1].gsubrs.cursor + lVar57 * 4));
            if (iVar28 == 0) {
              __assert_fail("glyph_index_in_font != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                            ,0x99c,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
            }
            stbtt_GetGlyphBitmapBoxSubpixel
                      (psVar65,iVar28,(float)pIVar82[lVar67].OversampleH * fVar69,
                       (float)pIVar82[lVar67].OversampleV * fVar69,fVar69,in_XMM3_Da,
                       (int *)asStack_258,(int *)auStack_440,(int *)&uStack_3c0,(int *)&sStack_44c);
            uVar62 = (pIVar82[lVar67].OversampleH +
                     (((stbtt_uint32)uStack_3c0 + iVar61) - (int)asStack_258[0].data)) - 1;
            lVar48 = *(long *)&psVar65[1].hmtx;
            *(short *)(lVar48 + -2 + lVar49) = (short)uVar62;
            uVar47 = (pIVar82[lVar67].OversampleV + ((sStack_44c + iVar61) - auStack_440._0_4_)) - 1
            ;
            *(short *)(lVar48 + lVar49) = (short)uVar47;
            iVar27 = iVar27 + (uVar47 & 0xffff) * (uVar62 & 0xffff);
            lVar57 = lVar57 + 1;
            lVar49 = lVar49 + 0x10;
          } while (lVar57 < *(int *)&psVar65[1].gsubrs.data);
          lVar67 = auStack_428._0_8_;
        }
      }
      lVar67 = lVar67 + 1;
    } while (lVar67 != lVar40);
    fVar69 = (float)iVar27;
  }
  if (fVar69 < 0.0) {
    fVar69 = sqrtf(fVar69);
  }
  else {
    fVar69 = SQRT(fVar69);
  }
  this->TexHeight = 0;
  iVar27 = this->TexDesiredWidth;
  if (iVar27 < 1) {
    iVar61 = (int)fVar69;
    iVar27 = 0x1000;
    if ((iVar61 < 0xb33) && (iVar27 = 0x800, iVar61 < 0x599)) {
      iVar27 = (uint)(0x2cb < iVar61) * 0x200 + 0x200;
    }
  }
  this->TexWidth = iVar27;
  iStack_450 = this->TexGlyphPadding;
  ptr_00 = (stbrp_context *)ImGui::MemAlloc(0x48);
  iVar61 = iVar27 - iStack_450;
  psStack_3d0 = (stbrp_node *)ImGui::MemAlloc((long)iVar61 << 4);
  if ((ptr_00 == (stbrp_context *)0x0) || (psStack_3d0 == (stbrp_node *)0x0)) {
    if (ptr_00 != (stbrp_context *)0x0) {
      ImGui::MemFree(ptr_00);
    }
    if (psStack_3d0 != (stbrp_node *)0x0) {
      ImGui::MemFree(psStack_3d0);
    }
    psStack_3d0 = (stbrp_node *)0x0;
    iStack_450 = 0;
    iVar27 = 0;
    ptr_00 = (stbrp_context *)0x0;
  }
  else {
    if ((iStack_450 < -0x7fff) || (0xffff < iVar61)) {
      __assert_fail("width <= 0xffff && height <= 0xffff",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imstb_rectpack.h"
                    ,0x10a,"void stbrp_init_target(stbrp_context *, int, int, stbrp_node *, int)");
    }
    if (iVar61 < 2) {
      uVar29 = 0;
    }
    else {
      uVar29 = 0;
      psVar11 = psStack_3d0;
      do {
        uVar29 = uVar29 + 1;
        psVar11->next = psVar11 + 1;
        psVar11 = psVar11 + 1;
      } while (iVar61 - 1 != uVar29);
      uVar29 = uVar29 & 0xffffffff;
    }
    psStack_3d0[uVar29].next = (stbrp_node *)0x0;
    ptr_00->init_mode = 1;
    ptr_00->heuristic = 0;
    ptr_00->free_head = psStack_3d0;
    ptr_00->active_head = ptr_00->extra;
    ptr_00->width = iVar61;
    ptr_00->height = 0x8000 - iStack_450;
    ptr_00->num_nodes = iVar61;
    ptr_00->align = (iVar61 * 2 + -1) / iVar61;
    ptr_00->extra[0].x = 0;
    ptr_00->extra[0].y = 0;
    ptr_00->extra[0].next = ptr_00->extra + 1;
    ptr_00->extra[1].x = (stbrp_coord)iVar61;
    ptr_00->extra[1].y = 0xffff;
    ptr_00->extra[1].next = (stbrp_node *)0x0;
  }
  psStack_2e8 = ptr_00;
  ImFontAtlasBuildPackCustomRects(this,ptr_00);
  if (0 < (int)uVar6) {
    lVar67 = 0;
    do {
      lVar57 = lVar67 * 0x110;
      iVar61 = *(int *)((long)pvStack_490 + lVar57 + 0xe8);
      if (iVar61 != 0) {
        stbrp_pack_rects(psStack_2e8,*(stbrp_rect **)((long)pvStack_490 + lVar57 + 200),iVar61);
        lVar49 = (long)*(int *)((long)pvStack_490 + lVar57 + 0xe8);
        if (0 < lVar49) {
          lVar57 = *(long *)((long)pvStack_490 + lVar57 + 200);
          lVar48 = 0;
          do {
            if (*(int *)(lVar57 + 0xc + lVar48) != 0) {
              iVar61 = (uint)*(ushort *)(lVar57 + 6 + lVar48) +
                       (uint)*(ushort *)(lVar57 + 10 + lVar48);
              if (iVar61 < this->TexHeight) {
                iVar61 = this->TexHeight;
              }
              this->TexHeight = iVar61;
            }
            lVar48 = lVar48 + 0x10;
          } while (lVar49 * 0x10 != lVar48);
        }
      }
      lVar67 = lVar67 + 1;
    } while (lVar67 != lVar40);
  }
  uVar26 = this->TexHeight;
  if ((this->Flags & 1) == 0) {
    uVar26 = (int)(uVar26 - 1) >> 1 | uVar26 - 1;
    uVar26 = (int)uVar26 >> 2 | uVar26;
    uVar26 = (int)uVar26 >> 4 | uVar26;
    uVar26 = (int)uVar26 >> 8 | uVar26;
    uVar26 = (int)uVar26 >> 0x10 | uVar26;
  }
  iVar28 = uVar26 + 1;
  this->TexHeight = iVar28;
  iVar61 = this->TexWidth;
  (this->TexUvScale).x = 1.0 / (float)iVar61;
  (this->TexUvScale).y = 1.0 / (float)iVar28;
  puVar33 = (uchar *)ImGui::MemAlloc((long)(iVar28 * iVar61));
  this->TexPixelsAlpha8 = puVar33;
  memset(puVar33,0,(long)this->TexHeight * (long)this->TexWidth);
  if (0 < (int)uVar6) {
    puStack_358 = this->TexPixelsAlpha8;
    lVar57 = (long)iVar27;
    lVar49 = 0;
    iStack_310 = iVar27;
    lVar67 = lVar57;
    do {
      lStack_370 = lVar49;
      if ((this->ConfigData).Size <= lVar49) goto LAB_00137e4b;
      if (*(int *)((long)pvStack_490 + lVar49 * 0x110 + 0xe8) != 0) {
        psVar65 = (stbtt_fontinfo *)(lVar49 * 0x110 + (long)pvStack_490);
        fStack_2d8 = *(float *)&psVar65[1].userdata;
        psStack_390 = psVar65;
        if (fStack_2d8 <= 0.0) {
          uStack_2d4 = 0x80000000;
          uStack_2d0 = 0x80000000;
          uStack_2cc = 0x80000000;
          fStack_2d8 = -fStack_2d8;
          uVar26 = (uint)(ushort)(*(ushort *)(psVar65->data + (long)psVar65->head + 0x12) << 8 |
                                 *(ushort *)(psVar65->data + (long)psVar65->head + 0x12) >> 8);
        }
        else {
          puVar33 = psVar65->data;
          lVar49 = (long)psVar65->hhea;
          uVar26 = ((int)(short)((ushort)puVar33[lVar49 + 4] << 8) | (uint)puVar33[lVar49 + 5]) -
                   ((int)(short)((ushort)puVar33[lVar49 + 6] << 8) | (uint)puVar33[lVar49 + 7]);
          uStack_2d4 = 0;
          uStack_2d0 = 0;
          uStack_2cc = 0;
        }
        fStack_2d8 = fStack_2d8 / (float)(int)uVar26;
        bVar64 = (byte)psVar65[1].glyf;
        fVar69 = (float)bVar64;
        fStack_37c = 0.0;
        fStack_380 = 0.0;
        uStack_410 = (ulong)bVar64;
        uVar29 = uStack_410;
        uStack_410._0_4_ = (uint)bVar64;
        if (bVar64 != 0) {
          fStack_380 = (float)(int)(1 - (uint)uStack_410) / (fVar69 + fVar69);
        }
        bVar3 = *(byte *)((long)&psVar65[1].glyf + 1);
        fVar76 = (float)bVar3;
        if (bVar3 != 0) {
          fStack_37c = (float)(int)(1 - (uint)bVar3) / (fVar76 + fVar76);
        }
        pIStack_2b8 = (this->ConfigData).Data;
        uStack_410 = uVar29;
        if (0 < psVar65[1].fontstart) {
          lVar49._0_4_ = psVar65[1].hmtx;
          lVar49._4_4_ = psVar65[1].kern;
          fVar73 = 1.0 / fVar69;
          fStack_31c = fVar73;
          fStack_320 = 1.0 / fVar76;
          fStack_3b4 = fVar69 * fStack_2d8;
          fVar76 = fVar76 * fStack_2d8;
          fVar69 = fVar76;
          if (fStack_3b4 <= fVar76) {
            fVar69 = fStack_3b4;
          }
          fStack_374 = (0.35 / fVar69) * (0.35 / fVar69);
          auStack_268 = ZEXT416((uint)fVar76);
          fVar76 = -fVar76;
          fStack_48 = fVar76;
          uStack_44 = 0x80000000;
          uStack_40 = 0x80000000;
          uStack_3c = 0x80000000;
          uStack_290 = (ulong)bVar64;
          uStack_298 = (ulong)(uint)bVar3;
          uStack_408 = (ulong)bVar3;
          lVar48 = 0;
          lStack_2b0 = lVar49;
          do {
            if (((*(int *)(lVar49 + 0xc + lVar48 * 0x10) != 0) &&
                (lVar34 = lVar48 * 0x10 + lVar49, *(short *)(lVar34 + 4) != 0)) &&
               (*(short *)(lVar34 + 6) != 0)) {
              if (psVar65[1].data == (uchar *)0x0) {
                iVar27 = *(int *)((long)&psVar65[1].userdata + 4) + (int)lVar48;
              }
              else {
                iVar27 = *(int *)(psVar65[1].data + lVar48 * 4);
              }
              psStack_2a8 = (short *)(lVar48 * 0x1c + *(long *)&psVar65[1].loca);
              lStack_368 = lVar34;
              lStack_2a0 = lVar48;
              iVar61 = stbtt_FindGlyphIndex(psVar65,iVar27);
              lVar34 = lStack_368;
              sVar38 = (short)iStack_450;
              *(short *)(lStack_368 + 8) = *(short *)(lStack_368 + 8) + sVar38;
              *(short *)(lStack_368 + 10) = *(short *)(lStack_368 + 10) + sVar38;
              *(short *)(lStack_368 + 4) = *(short *)(lStack_368 + 4) - sVar38;
              *(short *)(lStack_368 + 6) = *(short *)(lStack_368 + 6) - sVar38;
              puVar33 = psVar65->data;
              uVar17 = *(ushort *)(puVar33 + (long)psVar65->hhea + 0x22) << 8 |
                       *(ushort *)(puVar33 + (long)psVar65->hhea + 0x22) >> 8;
              iVar27 = psVar65->hmtx;
              lVar49 = (ulong)uVar17 * 4 + (long)iVar27 + -4;
              lVar48 = (ulong)uVar17 * 4 + (long)iVar27 + -3;
              if (iVar61 < (int)(uint)uVar17) {
                lVar49 = (long)(iVar61 * 4) + (long)iVar27;
                lVar48 = (long)(iVar61 * 4) + 1 + (long)iVar27;
              }
              uStack_314 = (uint)puVar33[lVar49];
              uStack_318 = (uint)puVar33[lVar48];
              stbtt_GetGlyphBitmapBoxSubpixel
                        (psVar65,iVar61,fStack_3b4,(float)auStack_268._0_4_,fVar73,fVar76,
                         &iStack_300,&iStack_304,&iStack_26c,&iStack_270);
              uVar62 = (uint)*(ushort *)(lVar34 + 8);
              uVar71 = 0;
              puStack_348 = (uchar *)(ulong)*(ushort *)(lVar34 + 10);
              uStack_3c8 = (ulong)*(ushort *)(lVar34 + 4);
              uStack_360 = (ulong)*(ushort *)(lVar34 + 6);
              uVar26 = stbtt_GetGlyphShape(psVar65,iVar61,(stbtt_vertex **)&uStack_3c0);
              uVar29 = uStack_408;
              uVar52 = ((int)uStack_3c8 - (int)uStack_410) + 1;
              stbtt_GetGlyphBitmapBoxSubpixel
                        (psStack_390,iVar61,fStack_3b4,(float)auStack_268._0_4_,fVar73,fVar76,
                         (int *)&sStack_44c,&iStack_2fc,(int *)0x0,(int *)0x0);
              uStack_3ac = uVar52;
              if (uVar52 != 0) {
                iVar27 = ((int)uStack_360 - (int)uVar29) + 1;
                auStack_3a8._0_4_ = iVar27;
                if (iVar27 != 0) {
                  lVar49 = CONCAT44(uStack_3c0._4_4_,(stbtt_uint32)uStack_3c0);
                  asStack_258[0].data = (uchar *)((ulong)asStack_258[0].data & 0xffffffff00000000);
                  if ((int)uVar26 < 1) {
                    uVar41 = 0;
                  }
                  else {
                    lVar48 = 0;
                    uVar41 = 0;
                    do {
                      uVar41 = (ulong)((int)uVar41 +
                                      (uint)(*(char *)(lVar49 + 0xc + lVar48) == '\x01'));
                      lVar48 = lVar48 + 0xe;
                    } while ((ulong)uVar26 * 0xe != lVar48);
                  }
                  iStack_378 = iStack_2fc;
                  sVar25 = sStack_44c;
                  if ((int)uVar41 == 0) {
LAB_001364e8:
                    pvStack_448 = (void *)0x0;
LAB_001364f1:
                    points = (stbtt__point *)0x0;
                  }
                  else {
                    pvStack_448 = ImGui::MemAlloc((long)(int)uVar41 << 2);
                    if (pvStack_448 == (void *)0x0) {
                      uVar41 = 0;
                      goto LAB_001364f1;
                    }
                    uVar55 = 0;
                    iVar27 = 0;
                    points = (stbtt__point *)0x0;
                    do {
                      auStack_428._0_8_ = uVar55;
                      if ((int)uVar55 == 0) {
LAB_001362aa:
                        asStack_258[0].data =
                             (uchar *)((ulong)asStack_258[0].data & 0xffffffff00000000);
                        if ((int)uVar26 < 1) {
                          lVar48 = -1;
                        }
                        else {
                          uVar52 = 0xffffffff;
                          fVar76 = 0.0;
                          lVar48 = 0;
                          fVar69 = 0.0;
                          lVar57 = lVar67;
                          do {
                            puVar33 = asStack_258[0].data;
                            switch(*(undefined1 *)(lVar49 + 0xc + lVar48)) {
                            case 1:
                              if (-1 < (int)uVar52) {
                                *(int *)((long)pvStack_448 + (ulong)uVar52 * 4) =
                                     (int)asStack_258[0].data - iVar27;
                              }
                              uVar52 = uVar52 + 1;
                              sVar38 = *(short *)(lVar49 + lVar48);
                              sVar18 = *(short *)(lVar49 + 2 + lVar48);
                              iVar27 = (int)asStack_258[0].data;
                              break;
                            case 2:
                              sVar38 = *(short *)(lVar49 + lVar48);
                              sVar18 = *(short *)(lVar49 + 2 + lVar48);
                              break;
                            case 3:
                              stbtt__tesselate_curve
                                        (points,(int *)asStack_258,fVar69,fVar76,
                                         (float)(int)*(short *)(lVar49 + 4 + lVar48),
                                         (float)(int)*(short *)(lVar49 + 6 + lVar48),
                                         (float)(int)*(short *)(lVar49 + lVar48),
                                         (float)(int)*(short *)(lVar49 + 2 + lVar48),fStack_374,0);
                              goto LAB_0013640f;
                            case 4:
                              stbtt__tesselate_cubic
                                        (points,(int *)asStack_258,fVar69,fVar76,
                                         (float)(int)*(short *)(lVar49 + 4 + lVar48),
                                         (float)(int)*(short *)(lVar49 + 6 + lVar48),
                                         (float)(int)*(short *)(lVar49 + 8 + lVar48),
                                         (float)(int)*(short *)(lVar49 + 10 + lVar48),
                                         (float)(int)*(short *)(lVar49 + lVar48),
                                         (float)(int)*(short *)(lVar49 + 2 + lVar48),fStack_374,0);
LAB_0013640f:
                              fVar69 = (float)(int)*(short *)(lVar49 + lVar48);
                              fVar76 = (float)(int)*(short *)(lVar49 + 2 + lVar48);
                              puVar33 = asStack_258[0].data;
                            default:
                              goto switchD_001362ee_default;
                            }
                            puVar33 = (uchar *)CONCAT44(asStack_258[0].data._4_4_,
                                                        (int)asStack_258[0].data + 1);
                            fVar76 = (float)(int)sVar18;
                            fVar69 = (float)(int)sVar38;
                            if (points != (stbtt__point *)0x0) {
                              points[(int)asStack_258[0].data].x = fVar69;
                              points[(int)asStack_258[0].data].y = fVar76;
                            }
switchD_001362ee_default:
                            asStack_258[0].data = puVar33;
                            lVar48 = lVar48 + 0xe;
                          } while ((ulong)uVar26 * 0xe != lVar48);
                          lVar48 = (long)(int)uVar52;
                          uVar29 = uStack_408;
                          lVar67 = lVar57;
                        }
                        *(int *)((long)pvStack_448 + lVar48 * 4) = (int)asStack_258[0].data - iVar27
                        ;
                        bVar16 = true;
                      }
                      else {
                        points = (stbtt__point *)
                                 ImGui::MemAlloc((long)(int)asStack_258[0].data << 3);
                        if (points != (stbtt__point *)0x0) goto LAB_001362aa;
                        points = (stbtt__point *)0x0;
                        bVar16 = false;
                      }
                      if (!bVar16) {
                        ImGui::MemFree(points);
                        ImGui::MemFree(pvStack_448);
                        uVar41 = 0;
                        goto LAB_001364e8;
                      }
                      uVar55 = (ulong)(auStack_428._0_4_ + 1);
                    } while (auStack_428._0_4_ == 0);
                  }
                  psStack_350 = points;
                  if (points != (stbtt__point *)0x0) {
                    if ((int)uVar41 < 1) {
                      size = 0x14;
                    }
                    else {
                      uVar55 = 0;
                      lVar49 = 0;
                      do {
                        lVar49 = (long)(int)lVar49 + (long)*(int *)((long)pvStack_448 + uVar55 * 4);
                        uVar55 = uVar55 + 1;
                      } while (uVar41 != uVar55);
                      size = lVar49 * 0x14 + 0x14;
                    }
                    p = (stbtt__edge *)ImGui::MemAlloc(size);
                    if (p != (stbtt__edge *)0x0) {
                      if ((int)uVar41 < 1) {
                        uVar55 = 0;
                      }
                      else {
                        uVar44 = 0;
                        uVar55 = 0;
                        iVar27 = 0;
                        do {
                          iVar61 = *(int *)((long)pvStack_448 + uVar44 * 4);
                          if (0 < iVar61) {
                            uVar60 = (ulong)(iVar61 - 1);
                            uVar58 = 0;
                            do {
                              iVar28 = (int)uVar60;
                              fVar69 = psStack_350[(long)iVar27 + (long)iVar28].y;
                              fVar76 = psStack_350[(long)iVar27 + uVar58].y;
                              if ((fVar69 != fVar76) || (NAN(fVar69) || NAN(fVar76))) {
                                iVar59 = (int)uVar58;
                                iVar39 = iVar28;
                                if (fVar69 <= fVar76) {
                                  iVar39 = iVar59;
                                  iVar59 = iVar28;
                                }
                                iVar28 = (int)uVar55;
                                p[iVar28].invert = (uint)(fVar76 < fVar69);
                                p[iVar28].x0 = psStack_350[(long)iVar27 + (long)iVar39].x *
                                               fStack_3b4 + 0.0;
                                p[iVar28].y0 = psStack_350[(long)iVar27 + (long)iVar39].y *
                                               fStack_48 + 0.0;
                                p[iVar28].x1 = psStack_350[(long)iVar27 + (long)iVar59].x *
                                               fStack_3b4 + 0.0;
                                p[iVar28].y1 = psStack_350[(long)iVar27 + (long)iVar59].y *
                                               fStack_48 + 0.0;
                                uVar55 = (ulong)(iVar28 + 1);
                                lVar57 = lVar67;
                              }
                              uVar60 = uVar58 & 0xffffffff;
                              uVar58 = uVar58 + 1;
                              uVar29 = uStack_408;
                            } while ((long)uVar58 < (long)*(int *)((long)pvStack_448 + uVar44 * 4));
                          }
                          iVar27 = iVar27 + iVar61;
                          uVar44 = uVar44 + 1;
                        } while (uVar44 != uVar41);
                      }
                      iVar27 = (int)uVar55;
                      stbtt__sort_edges_quicksort(p,iVar27);
                      if (1 < iVar27) {
                        uVar41 = 1;
                        do {
                          fVar69 = p[uVar41].x0;
                          fVar76 = p[uVar41].y0;
                          iVar61 = p[uVar41].invert;
                          asStack_258[0].cursor = iVar61;
                          asStack_258[0].data = *(uchar **)&p[uVar41].x1;
                          uVar44 = uVar41 & 0xffffffff;
                          do {
                            uVar26 = (uint)uVar44;
                            if ((int)uVar26 < 1) break;
                            fVar73 = p[uVar44 - 1].y0;
                            if (fVar76 < fVar73) {
                              psVar63 = p + uVar44;
                              psVar63->invert = psVar63[-1].invert;
                              fVar70 = psVar63[-1].y0;
                              fVar75 = psVar63[-1].x1;
                              fVar72 = psVar63[-1].y1;
                              psVar63->x0 = psVar63[-1].x0;
                              psVar63->y0 = fVar70;
                              psVar63->x1 = fVar75;
                              psVar63->y1 = fVar72;
                              uVar44 = (ulong)(uVar26 - 1);
                            }
                            uVar26 = (uint)uVar44;
                          } while (fVar76 < fVar73);
                          if (uVar41 != uVar26) {
                            p[(int)uVar26].x0 = fVar69;
                            p[(int)uVar26].y0 = fVar76;
                            *(uchar **)&p[(int)uVar26].x1 = asStack_258[0].data;
                            p[(int)uVar26].invert = iVar61;
                          }
                          uVar41 = uVar41 + 1;
                        } while (uVar41 != uVar55);
                      }
                      uVar26 = (int)uStack_3c8 - (int)uStack_410;
                      uStack_3c8 = (ulong)uVar26;
                      auStack_440 = (undefined1  [8])0x0;
                      scanline = asStack_258;
                      if (0x3f < (int)uVar26) {
                        scanline = (stbtt__buf *)ImGui::MemAlloc((ulong)uStack_3ac * 8 + 4);
                      }
                      uVar26 = (int)uStack_360 - (int)uVar29;
                      uStack_360 = (ulong)uVar26;
                      p[iVar27].y0 = (float)(auStack_3a8._0_4_ + iStack_378) + 1.0;
                      if (uVar26 < 0x7fffffff) {
                        puStack_348 = puStack_358 +
                                      (long)puStack_348 * lVar57 + CONCAT44(uVar71,uVar62);
                        fStack_308 = (float)(int)sVar25;
                        lStack_288 = (long)(int)uStack_3ac;
                        pfStack_330 = (float *)((long)&scanline->data + lStack_288 * 4);
                        pfStack_2e0 = pfStack_330 + 1;
                        sStack_278 = lStack_288 * 4;
                        fStack_3b0 = (float)(int)uStack_3ac;
                        sStack_280 = (long)(int)(uint)uStack_3c8 * 4 + 8;
                        uStack_340 = 0;
                        uStack_338 = 0;
                        puStack_388 = (undefined8 *)0x0;
                        iStack_3fc = 0;
                        psStack_3f0 = (stbtt__active_edge *)0x0;
                        psVar63 = p;
                        iVar27 = iStack_378;
                        do {
                          fVar69 = (float)iVar27;
                          fVar76 = fVar69 + 1.0;
                          iStack_30c = iVar27;
                          memset(scanline,0,sStack_278);
                          memset(pfStack_330,0,sStack_280);
                          psVar66 = psStack_3f0;
                          if (auStack_440 != (undefined1  [8])0x0) {
                            auVar36 = auStack_440;
                            psVar45 = (stbtt__active_edge *)auStack_440;
                            do {
                              psVar46 = (stbtt__active_edge *)auVar36;
                              if (((stbtt__active_edge *)auVar36)->ey <= fVar69) {
                                psVar45->next = ((stbtt__active_edge *)auVar36)->next;
                                if ((((stbtt__active_edge *)auVar36)->direction == 0.0) &&
                                   (!NAN(((stbtt__active_edge *)auVar36)->direction))) {
                                  __assert_fail("z->direction",
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imstb_truetype.h"
                                                ,0xc63,
                                                "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                               );
                                }
                                ((stbtt__active_edge *)auVar36)->direction = 0.0;
                                ((stbtt__active_edge *)auVar36)->next = psVar66;
                                psVar46 = psVar45;
                                psVar66 = (stbtt__active_edge *)auVar36;
                              }
                              auVar36 = (undefined1  [8])psVar46->next;
                              psVar45 = psVar46;
                            } while (auVar36 != (undefined1  [8])0x0);
                          }
                          fVar73 = psVar63->y0;
                          if (fVar73 <= fVar76) {
                            bVar16 = iStack_378 != 0;
                            bVar68 = (int)uStack_338 == 0;
                            do {
                              if ((fVar73 != psVar63->y1) || (NAN(fVar73) || NAN(psVar63->y1))) {
                                if (psVar66 == (stbtt__active_edge *)0x0) {
                                  if (iStack_3fc == 0) {
                                    puVar37 = (undefined8 *)ImGui::MemAlloc(0x6408);
                                    if (puVar37 == (undefined8 *)0x0) {
                                      psStack_3f0 = psVar66;
                                      psVar66 = (stbtt__active_edge *)0x0;
                                      goto LAB_00137092;
                                    }
                                    *puVar37 = puStack_388;
                                    iStack_3fc = 800;
                                    puStack_388 = puVar37;
                                  }
                                  lVar57 = (long)iStack_3fc;
                                  iStack_3fc = iStack_3fc + -1;
                                  psStack_3f0 = psVar66;
                                  psVar66 = (stbtt__active_edge *)(puStack_388 + lVar57 * 4 + -3);
                                }
                                else {
                                  psStack_3f0 = psVar66->next;
                                }
LAB_00137092:
                                if (psVar66 == (stbtt__active_edge *)0x0) {
                                  __assert_fail("z != __null",
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imstb_truetype.h"
                                                ,0xad1,
                                                "stbtt__active_edge *stbtt__new_active(stbtt__hheap *, stbtt__edge *, int, float, void *)"
                                               );
                                }
                                fVar73 = psVar63->x0;
                                fVar70 = psVar63->y0;
                                fVar75 = psVar63->y1;
                                fVar72 = (psVar63->x1 - fVar73) / (fVar75 - fVar70);
                                psVar66->fdx = fVar72;
                                psVar66->fdy = (float)(-(uint)(fVar72 != 0.0) & (uint)(1.0 / fVar72)
                                                      );
                                psVar66->fx = ((fVar69 - fVar70) * fVar72 + fVar73) - fStack_308;
                                psVar66->direction =
                                     *(float *)(&DAT_0019cba4 + (ulong)(psVar63->invert == 0) * 4);
                                psVar66->sy = fVar70;
                                psVar66->ey = fVar75;
                                psVar66->next = (stbtt__active_edge *)0x0;
                                if (fVar75 < fVar69 && (bVar68 && bVar16)) {
                                  psVar66->ey = fVar69;
                                }
                                if (psVar66->ey < fVar69) {
                                  __assert_fail("z->ey >= scan_y_top",
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imstb_truetype.h"
                                                ,0xc76,
                                                "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                               );
                                }
                                psVar66->next = (stbtt__active_edge *)auStack_440;
                                auStack_440 = (undefined1  [8])psVar66;
                              }
                              else {
                                psStack_3f0 = psVar66;
                              }
                              fVar73 = psVar63[1].y0;
                              psVar63 = psVar63 + 1;
                              psVar66 = psStack_3f0;
                              auVar36 = auStack_440;
                            } while (fVar73 <= fVar76);
                          }
                          else {
                            psStack_3f0 = psVar66;
                            auVar36 = auStack_440;
                          }
                          for (; auVar36 != (undefined1  [8])0x0;
                              auVar36 = (undefined1  [8])((stbtt__active_edge *)auVar36)->next) {
                            fVar73 = ((stbtt__active_edge *)auVar36)->ey;
                            if (fVar73 < fVar69) {
                              __assert_fail("e->ey >= y_top",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imstb_truetype.h"
                                            ,0xba5,
                                            "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                           );
                            }
                            fVar70 = ((stbtt__active_edge *)auVar36)->fx;
                            fVar75 = ((stbtt__active_edge *)auVar36)->fdx;
                            if ((fVar75 != 0.0) || (NAN(fVar75))) {
                              fVar72 = ((stbtt__active_edge *)auVar36)->sy;
                              if (fVar76 < fVar72) {
                                __assert_fail("e->sy <= y_bottom && e->ey >= y_top",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imstb_truetype.h"
                                              ,3000,
                                              "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                             );
                              }
                              fVar79 = fVar75 + fVar70;
                              fVar74 = (float)(~-(uint)(fVar69 < fVar72) & (uint)fVar70 |
                                              (uint)((fVar72 - fVar69) * fVar75 + fVar70) &
                                              -(uint)(fVar69 < fVar72));
                              if ((((fVar74 < 0.0) ||
                                   (fVar78 = (float)(~-(uint)(fVar73 < fVar76) & (uint)fVar79 |
                                                    (uint)((fVar73 - fVar69) * fVar75 + fVar70) &
                                                    -(uint)(fVar73 < fVar76)), fVar78 < 0.0)) ||
                                  (fStack_3b0 <= fVar74)) || (fStack_3b0 <= fVar78)) {
                                if ((uint)uStack_3c8 < 0x7fffffff) {
                                  auStack_2f8 = ZEXT416((uint)fVar70);
                                  auStack_3a8 = ZEXT416((uint)fVar79);
                                  sStack_328 = CONCAT44(sStack_328._4_4_,fVar75);
                                  fVar73 = fVar69;
                                  uVar26 = 0;
                                  do {
                                    fVar72 = (float)(int)uVar26;
                                    uVar52 = uVar26 + 1;
                                    fVar74 = (float)(int)uVar52;
                                    fVar78 = (fVar72 - fVar70) / fVar75 + fVar73;
                                    fVar75 = (fVar74 - fVar70) / fVar75 + fVar73;
                                    auStack_428._0_4_ = fVar72;
                                    fVar69 = fVar73;
                                    if ((fVar72 <= fVar70) || (fVar79 <= fVar74)) {
                                      if ((fVar79 < fVar72) && (fVar74 < fVar70)) {
                                        stbtt__handle_clipped_edge
                                                  ((float *)scanline,uVar26,
                                                   (stbtt__active_edge *)auVar36,fVar70,fVar73,
                                                   fVar74,fVar75);
                                        fVar73 = fVar75;
                                        fVar70 = fVar74;
                                        fVar72 = (float)auStack_428._0_4_;
LAB_00136c58:
                                        stbtt__handle_clipped_edge
                                                  ((float *)scanline,uVar26,
                                                   (stbtt__active_edge *)auVar36,fVar70,fVar73,
                                                   fVar72,fVar78);
                                        fVar70 = (float)auStack_428._0_4_;
                                        fVar73 = fVar78;
                                        goto LAB_00136c74;
                                      }
                                      if (((fVar70 < fVar72) && (fVar72 < fVar79)) ||
                                         ((fVar79 < fVar72 && (fVar72 < fVar70))))
                                      goto LAB_00136c58;
                                      if (((fVar70 < fVar74) && (fVar74 < fVar79)) ||
                                         ((fVar79 < fVar74 && (fVar74 < fVar70))))
                                      goto LAB_00136bc7;
                                    }
                                    else {
                                      stbtt__handle_clipped_edge
                                                ((float *)scanline,uVar26,
                                                 (stbtt__active_edge *)auVar36,fVar70,fVar73,fVar72,
                                                 fVar78);
                                      fVar70 = (float)auStack_428._0_4_;
                                      fVar73 = fVar78;
LAB_00136bc7:
                                      stbtt__handle_clipped_edge
                                                ((float *)scanline,uVar26,
                                                 (stbtt__active_edge *)auVar36,fVar70,fVar73,fVar74,
                                                 fVar75);
                                      fVar70 = fVar74;
                                      fVar73 = fVar75;
LAB_00136c74:
                                      fVar79 = (float)auStack_3a8._0_4_;
                                    }
                                    stbtt__handle_clipped_edge
                                              ((float *)scanline,uVar26,
                                               (stbtt__active_edge *)auVar36,fVar70,fVar73,fVar79,
                                               fVar76);
                                    fVar75 = (float)sStack_328;
                                    fVar70 = (float)auStack_2f8._0_4_;
                                    fVar79 = (float)auStack_3a8._0_4_;
                                    fVar73 = fVar69;
                                    uVar26 = uVar52;
                                  } while (uStack_3ac != uVar52);
                                }
                              }
                              else {
                                if (fVar72 <= fVar69) {
                                  fVar72 = fVar69;
                                }
                                uVar26 = (uint)fVar74;
                                if (fVar76 <= fVar73) {
                                  fVar73 = fVar76;
                                }
                                if (uVar26 == (int)fVar78) {
                                  if (((int)uVar26 < 0) || ((int)(uint)uStack_3c8 < (int)uVar26)) {
                                    __assert_fail("x >= 0 && x < len",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imstb_truetype.h"
                                                  ,0xbd4,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                 );
                                  }
                                  uVar29 = (ulong)uVar26;
                                  *(float *)((long)&scanline->data + uVar29 * 4) =
                                       (((fVar78 - (float)(int)uVar26) +
                                        (fVar74 - (float)(int)uVar26)) * -0.5 + 1.0) *
                                       ((stbtt__active_edge *)auVar36)->direction *
                                       (fVar73 - fVar72) +
                                       *(float *)((long)&scanline->data + uVar29 * 4);
                                  fVar70 = (fVar73 - fVar72) *
                                           ((stbtt__active_edge *)auVar36)->direction;
                                }
                                else {
                                  fVar75 = ((stbtt__active_edge *)auVar36)->fdy;
                                  fVar77 = fVar78;
                                  if (fVar78 < fVar74) {
                                    fVar70 = fVar69 - fVar72;
                                    fVar72 = (fVar69 - fVar73) + fVar76;
                                    fVar75 = -fVar75;
                                    fVar73 = fVar70 + fVar76;
                                    fVar77 = fVar74;
                                    fVar70 = fVar79;
                                    fVar74 = fVar78;
                                  }
                                  iVar61 = (int)fVar77;
                                  iVar27 = (int)fVar74 + 1;
                                  fVar78 = ((float)iVar27 - fVar70) * fVar75 + fVar69;
                                  fVar70 = ((stbtt__active_edge *)auVar36)->direction;
                                  fVar79 = (fVar78 - fVar72) * fVar70;
                                  lVar57 = (long)(int)fVar74;
                                  *(float *)((long)&scanline->data + lVar57 * 4) =
                                       (((fVar74 - (float)(int)fVar74) + 1.0) * -0.5 + 1.0) * fVar79
                                       + *(float *)((long)&scanline->data + lVar57 * 4);
                                  if (iVar61 - iVar27 != 0 && iVar27 <= iVar61) {
                                    do {
                                      *(float *)((long)&scanline->data + lVar57 * 4 + 4) =
                                           fVar75 * fVar70 * 0.5 + fVar79 +
                                           *(float *)((long)&scanline->data + lVar57 * 4 + 4);
                                      fVar79 = fVar79 + fVar75 * fVar70;
                                      lVar57 = lVar57 + 1;
                                    } while (iVar61 + -1 != (int)lVar57);
                                  }
                                  if (1.01 < ABS(fVar79)) {
                                    __assert_fail("fabsf(area) <= 1.01f",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imstb_truetype.h"
                                                  ,0xbfb,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                 );
                                  }
                                  uVar29 = (ulong)iVar61;
                                  *(float *)((long)&scanline->data + uVar29 * 4) =
                                       (fVar73 - (fVar75 * (float)(iVar61 - iVar27) + fVar78)) *
                                       (((fVar77 - (float)iVar61) + 0.0) * -0.5 + 1.0) * fVar70 +
                                       fVar79 + *(float *)((long)&scanline->data + uVar29 * 4);
                                  fVar70 = (fVar73 - fVar72) * fVar70;
                                }
                                pfStack_2e0[uVar29] = fVar70 + pfStack_2e0[uVar29];
                              }
                            }
                            else if (fVar70 < fStack_3b0) {
                              if (0.0 <= fVar70) {
                                auStack_2f8 = ZEXT416((uint)fVar70);
                                stbtt__handle_clipped_edge
                                          ((float *)scanline,(int)fVar70,
                                           (stbtt__active_edge *)auVar36,fVar70,fVar69,fVar70,fVar76
                                          );
                                iVar27 = (int)fVar70 + 1;
                                fVar70 = (float)auStack_2f8._0_4_;
                              }
                              else {
                                iVar27 = 0;
                              }
                              stbtt__handle_clipped_edge
                                        (pfStack_330,iVar27,(stbtt__active_edge *)auVar36,fVar70,
                                         fVar69,fVar70,fVar76);
                            }
                          }
                          auVar36 = auStack_440;
                          if ((uint)uStack_3c8 < 0x7fffffff) {
                            fVar69 = 0.0;
                            psVar35 = scanline;
                            uVar29 = uStack_340;
                            lVar57 = lStack_288;
                            do {
                              fVar69 = fVar69 + *(float *)((long)&psVar35->data + lStack_288 * 4);
                              iVar27 = (int)(ABS(*(float *)&psVar35->data + fVar69) * 255.0 + 0.5);
                              uVar54 = (uchar)iVar27;
                              if (0xfe < iVar27) {
                                uVar54 = 0xff;
                              }
                              puStack_348[(int)uVar29] = uVar54;
                              uVar29 = (ulong)((int)uVar29 + 1);
                              psVar35 = (stbtt__buf *)((long)&psVar35->data + 4);
                              lVar57 = lVar57 + -1;
                            } while (lVar57 != 0);
                          }
                          for (; auVar36 != (undefined1  [8])0x0;
                              auVar36 = (undefined1  [8])((stbtt__active_edge *)auVar36)->next) {
                            ((stbtt__active_edge *)auVar36)->fx =
                                 ((stbtt__active_edge *)auVar36)->fdx +
                                 ((stbtt__active_edge *)auVar36)->fx;
                          }
                          iVar27 = iStack_30c + 1;
                          iVar61 = (int)uStack_338;
                          uStack_338 = (ulong)(iVar61 + 1);
                          uStack_340 = (ulong)(uint)((int)uStack_340 + iStack_310);
                          puVar37 = puStack_388;
                          lVar57 = lVar67;
                          uVar29 = uStack_408;
                        } while (iVar61 != (int)uStack_360);
                      }
                      else {
                        puStack_388 = (undefined8 *)0x0;
                        puVar37 = puStack_388;
                        lVar57 = lVar67;
                      }
                      while (puVar37 != (undefined8 *)0x0) {
                        puVar9 = (undefined8 *)*puVar37;
                        ImGui::MemFree(puVar37);
                        puVar37 = puVar9;
                      }
                      if (scanline != asStack_258) {
                        ImGui::MemFree(scanline);
                      }
                      ImGui::MemFree(p);
                    }
                    ImGui::MemFree(pvStack_448);
                    ImGui::MemFree(psStack_350);
                  }
                }
              }
              bVar64 = (byte)uVar29;
              ImGui::MemFree((void *)CONCAT44(uStack_3c0._4_4_,(stbtt_uint32)uStack_3c0));
              if (1 < (byte)uStack_410) {
                uVar17 = *(ushort *)(lStack_368 + 4);
                uVar5 = *(ushort *)(lStack_368 + 6);
                asStack_258[0].data = (uchar *)0x0;
                lVar57 = lVar67;
                if (uVar5 != 0) {
                  puVar33 = puStack_358 +
                            (ulong)*(ushort *)(lStack_368 + 10) * lVar67 +
                            (ulong)*(ushort *)(lStack_368 + 8);
                  iVar27 = uVar17 - (uint)uStack_410;
                  uVar29 = (ulong)(iVar27 + 1);
                  uVar26 = 0;
                  do {
                    uVar41 = uStack_410;
                    memset(asStack_258,0,uStack_410);
                    switch((int)uVar41) {
                    case 2:
                      if (iVar27 < 0) {
LAB_00137418:
                        uVar55 = 0;
                        uVar41 = 0;
                      }
                      else {
                        uVar55 = 0;
                        uVar41 = 0;
                        do {
                          bVar64 = puVar33[uVar55];
                          bVar3 = *(byte *)((long)&asStack_258[0].data + (ulong)((uint)uVar55 & 7));
                          *(byte *)((long)&asStack_258[0].data + (ulong)((uint)uVar55 + 2 & 7)) =
                               bVar64;
                          uVar52 = (int)uVar41 + ((uint)bVar64 - (uint)bVar3);
                          uVar41 = (ulong)uVar52;
                          puVar33[uVar55] = (uchar)(uVar52 >> 1);
                          uVar55 = uVar55 + 1;
                        } while (uVar29 != uVar55);
                      }
                      break;
                    case 3:
                      if (iVar27 < 0) goto LAB_00137418;
                      uVar55 = 0;
                      uVar41 = 0;
                      do {
                        bVar64 = puVar33[uVar55];
                        bVar3 = *(byte *)((long)&asStack_258[0].data + (ulong)((uint)uVar55 & 7));
                        *(byte *)((long)&asStack_258[0].data + (ulong)((uint)uVar55 + 3 & 7)) =
                             bVar64;
                        uVar41 = (ulong)((int)uVar41 + ((uint)bVar64 - (uint)bVar3));
                        puVar33[uVar55] = (uchar)(uVar41 / 3);
                        uVar55 = uVar55 + 1;
                      } while (uVar29 != uVar55);
                      break;
                    case 4:
                      if (iVar27 < 0) goto LAB_00137418;
                      uVar55 = 0;
                      uVar41 = 0;
                      do {
                        bVar64 = puVar33[uVar55];
                        uVar44 = (ulong)((uint)uVar55 & 7);
                        bVar3 = *(byte *)((long)&asStack_258[0].data + uVar44);
                        *(byte *)((long)&asStack_258[0].data + (uVar44 ^ 4)) = bVar64;
                        uVar52 = (int)uVar41 + ((uint)bVar64 - (uint)bVar3);
                        uVar41 = (ulong)uVar52;
                        puVar33[uVar55] = (uchar)(uVar52 >> 2);
                        uVar55 = uVar55 + 1;
                      } while (uVar29 != uVar55);
                      break;
                    case 5:
                      if (iVar27 < 0) goto LAB_00137418;
                      uVar55 = 0;
                      uVar41 = 0;
                      do {
                        bVar64 = puVar33[uVar55];
                        bVar3 = *(byte *)((long)&asStack_258[0].data + (ulong)((uint)uVar55 & 7));
                        *(byte *)((long)&asStack_258[0].data + (ulong)((uint)uVar55 + 5 & 7)) =
                             bVar64;
                        uVar41 = (ulong)((int)uVar41 + ((uint)bVar64 - (uint)bVar3));
                        puVar33[uVar55] = (uchar)(uVar41 / 5);
                        uVar55 = uVar55 + 1;
                      } while (uVar29 != uVar55);
                      break;
                    default:
                      if (iVar27 < 0) goto LAB_00137418;
                      uVar55 = 0;
                      uVar41 = 0;
                      do {
                        bVar64 = puVar33[uVar55];
                        bVar3 = *(byte *)((long)&asStack_258[0].data + (ulong)((uint)uVar55 & 7));
                        *(byte *)((long)&asStack_258[0].data +
                                 (ulong)((int)uStack_290 + (uint)uVar55 & 7)) = bVar64;
                        uVar41 = (ulong)((int)uVar41 + ((uint)bVar64 - (uint)bVar3));
                        puVar33[uVar55] = (uchar)(uVar41 / (uStack_410 & 0xffffffff));
                        uVar55 = uVar55 + 1;
                      } while (uVar29 != uVar55);
                    }
                    if ((int)uVar55 < (int)(uint)uVar17) {
                      uVar55 = uVar55 & 0xffffffff;
                      do {
                        if (puVar33[uVar55] != '\0') {
                          __assert_fail("pixels[i] == 0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imstb_truetype.h"
                                        ,0xf41,
                                        "void stbtt__h_prefilter(unsigned char *, int, int, int, unsigned int)"
                                       );
                        }
                        uVar52 = (int)uVar41 -
                                 (uint)*(byte *)((long)&asStack_258[0].data +
                                                (ulong)((uint)uVar55 & 7));
                        uVar41 = (ulong)uVar52;
                        puVar33[uVar55] = (uchar)(uVar52 / (uint)uStack_410);
                        uVar55 = uVar55 + 1;
                      } while ((int)uVar55 < (int)(uint)uVar17);
                    }
                    puVar33 = puVar33 + lVar57;
                    uVar26 = uVar26 + 1;
                  } while (uVar26 != uVar5);
                }
                bVar64 = (byte)uStack_408;
                lVar67 = lVar57;
              }
              if (1 < bVar64) {
                uVar17 = *(ushort *)(lStack_368 + 4);
                uVar26 = (uint)*(ushort *)(lStack_368 + 6);
                asStack_258[0].data = (uchar *)0x0;
                lVar57 = lVar67;
                if (uVar17 != 0) {
                  pbVar51 = puStack_358 +
                            (ulong)*(ushort *)(lStack_368 + 10) * lVar67 +
                            (ulong)*(ushort *)(lStack_368 + 8);
                  iVar27 = uVar26 - (uint)uStack_408;
                  uVar29 = (ulong)(iVar27 + 1);
                  uVar52 = 0;
                  do {
                    uVar41 = uStack_408;
                    memset(asStack_258,0,uStack_408);
                    switch((int)uVar41) {
                    case 2:
                      if (iVar27 < 0) {
LAB_001376b6:
                        uVar55 = 0;
                        uVar41 = 0;
                      }
                      else {
                        uVar55 = 0;
                        uVar41 = 0;
                        pbVar56 = pbVar51;
                        do {
                          bVar64 = *pbVar56;
                          bVar3 = *(byte *)((long)&asStack_258[0].data + (ulong)((uint)uVar55 & 7));
                          *(byte *)((long)&asStack_258[0].data + (ulong)((uint)uVar55 + 2 & 7)) =
                               bVar64;
                          uVar62 = (int)uVar41 + ((uint)bVar64 - (uint)bVar3);
                          uVar41 = (ulong)uVar62;
                          *pbVar56 = (byte)(uVar62 >> 1);
                          uVar55 = uVar55 + 1;
                          pbVar56 = pbVar56 + lVar57;
                        } while (uVar29 != uVar55);
                      }
                      break;
                    case 3:
                      if (iVar27 < 0) goto LAB_001376b6;
                      uVar55 = 0;
                      uVar41 = 0;
                      pbVar56 = pbVar51;
                      do {
                        bVar64 = *pbVar56;
                        bVar3 = *(byte *)((long)&asStack_258[0].data + (ulong)((uint)uVar55 & 7));
                        *(byte *)((long)&asStack_258[0].data + (ulong)((uint)uVar55 + 3 & 7)) =
                             bVar64;
                        uVar41 = (ulong)((int)uVar41 + ((uint)bVar64 - (uint)bVar3));
                        *pbVar56 = (byte)(uVar41 / 3);
                        uVar55 = uVar55 + 1;
                        pbVar56 = pbVar56 + lVar57;
                      } while (uVar29 != uVar55);
                      break;
                    case 4:
                      if (iVar27 < 0) goto LAB_001376b6;
                      uVar55 = 0;
                      uVar41 = 0;
                      pbVar56 = pbVar51;
                      do {
                        bVar64 = *pbVar56;
                        uVar44 = (ulong)((uint)uVar55 & 7);
                        bVar3 = *(byte *)((long)&asStack_258[0].data + uVar44);
                        *(byte *)((long)&asStack_258[0].data + (uVar44 ^ 4)) = bVar64;
                        uVar62 = (int)uVar41 + ((uint)bVar64 - (uint)bVar3);
                        uVar41 = (ulong)uVar62;
                        *pbVar56 = (byte)(uVar62 >> 2);
                        uVar55 = uVar55 + 1;
                        pbVar56 = pbVar56 + lVar57;
                      } while (uVar29 != uVar55);
                      break;
                    case 5:
                      if (iVar27 < 0) goto LAB_001376b6;
                      uVar55 = 0;
                      uVar41 = 0;
                      pbVar56 = pbVar51;
                      do {
                        bVar64 = *pbVar56;
                        bVar3 = *(byte *)((long)&asStack_258[0].data + (ulong)((uint)uVar55 & 7));
                        *(byte *)((long)&asStack_258[0].data + (ulong)((uint)uVar55 + 5 & 7)) =
                             bVar64;
                        uVar41 = (ulong)((int)uVar41 + ((uint)bVar64 - (uint)bVar3));
                        *pbVar56 = (byte)(uVar41 / 5);
                        uVar55 = uVar55 + 1;
                        pbVar56 = pbVar56 + lVar57;
                      } while (uVar29 != uVar55);
                      break;
                    default:
                      if (iVar27 < 0) goto LAB_001376b6;
                      uVar55 = 0;
                      uVar41 = 0;
                      pbVar56 = pbVar51;
                      do {
                        bVar64 = *pbVar56;
                        bVar3 = *(byte *)((long)&asStack_258[0].data + (ulong)((uint)uVar55 & 7));
                        *(byte *)((long)&asStack_258[0].data +
                                 (ulong)((int)uStack_298 + (uint)uVar55 & 7)) = bVar64;
                        uVar41 = (ulong)((int)uVar41 + ((uint)bVar64 - (uint)bVar3));
                        *pbVar56 = (byte)(uVar41 / (uStack_408 & 0xffffffff));
                        uVar55 = uVar55 + 1;
                        pbVar56 = pbVar56 + lVar57;
                      } while (uVar29 != uVar55);
                    }
                    iVar61 = (int)uVar55;
                    iVar28 = uVar26 - iVar61;
                    if (iVar28 != 0 && iVar61 <= (int)uVar26) {
                      lVar67 = (long)iVar61;
                      pbVar56 = pbVar51 + lVar57 * lVar67;
                      do {
                        if (*pbVar56 != 0) {
                          __assert_fail("pixels[i*stride_in_bytes] == 0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imstb_truetype.h"
                                        ,0xf7f,
                                        "void stbtt__v_prefilter(unsigned char *, int, int, int, unsigned int)"
                                       );
                        }
                        uVar62 = (int)uVar41 -
                                 (uint)*(byte *)((long)&asStack_258[0].data +
                                                (ulong)((uint)lVar67 & 7));
                        uVar41 = (ulong)uVar62;
                        *pbVar56 = (byte)(uVar62 / (uint)uStack_408);
                        lVar67 = lVar67 + 1;
                        pbVar56 = pbVar56 + lVar57;
                        iVar28 = iVar28 + -1;
                      } while (iVar28 != 0);
                    }
                    pbVar51 = pbVar51 + 1;
                    uVar52 = uVar52 + 1;
                    lVar67 = lVar57;
                  } while (uVar52 != uVar17);
                }
              }
              sVar18 = (short)*(undefined4 *)(lStack_368 + 8);
              *psStack_2a8 = sVar18;
              sVar38 = *(short *)(lStack_368 + 10);
              psStack_2a8[1] = sVar38;
              uVar17 = *(ushort *)(lStack_368 + 4);
              psStack_2a8[2] = sVar18 + uVar17;
              uVar5 = *(ushort *)(lStack_368 + 6);
              psStack_2a8[3] = sVar38 + uVar5;
              *(float *)(psStack_2a8 + 8) =
                   (float)(int)(short)((short)(uStack_314 << 8) + (short)uStack_318) * fStack_2d8;
              *(float *)(psStack_2a8 + 4) = (float)iStack_300 * fStack_31c + fStack_380;
              *(float *)(psStack_2a8 + 6) = (float)iStack_304 * fStack_320 + fStack_37c;
              *(float *)(psStack_2a8 + 10) =
                   (float)(int)(iStack_300 + (uint)uVar17) * fStack_31c + fStack_380;
              *(float *)(psStack_2a8 + 0xc) =
                   (float)(int)(iStack_304 + (uint)uVar5) * fStack_320 + fStack_37c;
              lVar48 = lStack_2a0;
              lVar49 = lStack_2b0;
              psVar65 = psStack_390;
              fVar73 = fStack_37c;
              fVar76 = fStack_380;
            }
            lVar48 = lVar48 + 1;
          } while (lVar48 < psVar65[1].fontstart);
        }
        fVar69 = pIStack_2b8[lStack_370].RasterizerMultiply;
        if ((fVar69 != 1.0) || (NAN(fVar69))) {
          lVar49 = 0;
          do {
            uVar26 = (uint)(long)((float)(int)lVar49 * fVar69);
            if (0xfe < uVar26) {
              uVar26 = 0xff;
            }
            *(char *)((long)&asStack_258[0].data + lVar49) = (char)uVar26;
            lVar49 = lVar49 + 1;
          } while (lVar49 != 0x100);
          psVar65 = psStack_390;
          if (0 < psStack_390[1].cff.cursor) {
            lVar48._0_4_ = psStack_390[1].hmtx;
            lVar48._4_4_ = psStack_390[1].kern;
            iVar27 = 0;
            do {
              if ((*(int *)(lVar48 + 0xc) != 0) && (*(ushort *)(lVar48 + 6) != 0)) {
                uVar17 = *(ushort *)(lVar48 + 4);
                iVar61 = this->TexWidth;
                puVar33 = this->TexPixelsAlpha8 +
                          (ulong)*(ushort *)(lVar48 + 10) * (long)iVar61 +
                          (ulong)*(ushort *)(lVar48 + 8);
                uVar26 = (uint)*(ushort *)(lVar48 + 6);
                do {
                  if ((ulong)uVar17 != 0) {
                    uVar29 = 0;
                    do {
                      puVar33[uVar29] =
                           *(uchar *)((long)&asStack_258[0].data + (ulong)puVar33[uVar29]);
                      uVar29 = uVar29 + 1;
                    } while (uVar17 != uVar29);
                  }
                  puVar33 = puVar33 + iVar61;
                  bVar16 = 1 < (int)uVar26;
                  uVar26 = uVar26 - 1;
                } while (bVar16);
              }
              iVar27 = iVar27 + 1;
              lVar48 = lVar48 + 0x10;
            } while (iVar27 < psStack_390[1].cff.cursor);
          }
        }
        psVar65[1].hmtx = 0;
        psVar65[1].kern = 0;
      }
      lVar49 = lStack_370 + 1;
    } while (lVar49 != lVar40);
  }
  ImGui::MemFree(psStack_3d0);
  ImGui::MemFree(psStack_2e8);
  ptr = auStack_438._8_8_;
  if ((void *)auStack_438._8_8_ != (void *)0x0) {
    auVar12._8_8_ = 0;
    auVar12._0_8_ = auStack_438._8_8_;
    auStack_438 = auVar12 << 0x40;
    ImGui::MemFree((void *)ptr);
    auStack_438._8_8_ = 0;
  }
  if (0 < (int)uVar6) {
    lVar67 = 0;
    do {
      lVar57 = lVar67 * 0x110;
      if (*(int *)((long)pvStack_490 + lVar57 + 0xe8) != 0) {
        if ((this->ConfigData).Size <= lVar67) goto LAB_00137e4b;
        lVar49 = *(long *)((long)pvStack_490 + lVar57 + 8);
        lVar48 = (long)*(int *)((long)pvStack_490 + lVar57 + 0x24);
        uVar26 = (int)(short)((ushort)*(byte *)(lVar49 + 4 + lVar48) << 8) |
                 (uint)*(byte *)(lVar49 + 5 + lVar48);
        uVar71 = 0xbf800000;
        if (0 < (short)uVar26) {
          uVar71 = 0x3f800000;
        }
        auStack_428._0_4_ = uVar71;
        uVar52 = (int)(short)((ushort)*(byte *)(lVar49 + 6 + lVar48) << 8) |
                 (uint)*(byte *)(lVar49 + 7 + lVar48);
        fStack_468 = -1.0;
        if (0 < (short)uVar52) {
          fStack_468 = 1.0;
        }
        pIVar10 = (this->ConfigData).Data;
        pIVar82 = pIVar10 + lVar67;
        pIVar7 = pIVar10[lVar67].DstFont;
        if (pIVar10[lVar67].MergeMode == false) {
          fVar69 = pIVar10[lVar67].SizePixels;
          ImFont::ClearOutputData(pIVar7);
          fVar69 = fVar69 / (float)(int)(uVar26 - uVar52);
          pIVar7->FontSize = pIVar82->SizePixels;
          pIVar7->ConfigData = pIVar82;
          pIVar7->ConfigDataCount = 0;
          pIVar7->ContainerAtlas = this;
          pIVar7->Ascent = (float)(int)((float)(int)uVar26 * fVar69 + (float)auStack_428._0_4_);
          pIVar7->Descent = (float)(int)((float)(int)uVar52 * fVar69 + fStack_468);
        }
        pIVar7->ConfigDataCount = pIVar7->ConfigDataCount + 1;
        if (0 < *(int *)((long)pvStack_490 + lVar57 + 0xe8)) {
          fVar69 = (pIVar82->GlyphOffset).x;
          auStack_428 = ZEXT416((uint)((float)(int)(pIVar7->Ascent + 0.5) + (pIVar82->GlyphOffset).y
                                      ));
          lVar48 = 0;
          lVar49 = 0;
          do {
            if (*(int *)((long)pvStack_490 + lVar57 + 0x100) <= lVar49) goto LAB_00137dcf;
            lVar34 = *(long *)((long)pvStack_490 + lVar57 + 0xd0);
            fVar73 = 1.0 / (float)this->TexHeight;
            fVar76 = 1.0 / (float)this->TexWidth;
            ImFont::AddGlyph(pIVar7,pIVar82,
                             *(ImWchar *)
                              (*(long *)((long)pvStack_490 + lVar57 + 0x108) + lVar49 * 4),
                             *(float *)(lVar34 + 8 + lVar48) + 0.0 + fVar69,
                             *(float *)(lVar34 + 0xc + lVar48) + 0.0 + (float)auStack_428._0_4_,
                             *(float *)(lVar34 + 0x14 + lVar48) + 0.0 + fVar69,
                             *(float *)(lVar34 + 0x18 + lVar48) + 0.0 + (float)auStack_428._0_4_,
                             (float)*(ushort *)(lVar34 + lVar48) * fVar76,
                             (float)*(ushort *)(lVar34 + 2 + lVar48) * fVar73,
                             (float)*(ushort *)(lVar34 + 4 + lVar48) * fVar76,
                             (float)*(ushort *)(lVar34 + 6 + lVar48) * fVar73,
                             *(float *)(lVar34 + 0x10 + lVar48));
            lVar49 = lVar49 + 1;
            lVar48 = lVar48 + 0x1c;
          } while (lVar49 < *(int *)((long)pvStack_490 + lVar57 + 0xe8));
        }
      }
      lVar67 = lVar67 + 1;
    } while (lVar67 != lVar40);
  }
  sVar15 = sStack_2c0;
  if (0 < (int)uVar6) {
    sVar50 = 0;
    do {
      pvVar32 = *(void **)((long)pvStack_490 + sVar50 + 0x108);
      if (pvVar32 != (void *)0x0) {
        ImGui::MemFree(pvVar32);
      }
      pvVar32 = *(void **)((long)pvStack_490 + sVar50 + 0xf8);
      if (pvVar32 != (void *)0x0) {
        ImGui::MemFree(pvVar32);
      }
      sVar50 = sVar50 + 0x110;
    } while (sVar15 != sVar50);
  }
  ImFontAtlasBuildFinish(this);
  if (pvStack_3e0 != (void *)0x0) {
    ImGui::MemFree(pvStack_3e0);
  }
  if ((void *)auStack_438._8_8_ != (void *)0x0) {
    ImGui::MemFree((void *)auStack_438._8_8_);
  }
LAB_00137cbd:
  bVar64 = (byte)((uint)uVar81 >> 0x18);
  if (pvStack_3f8 != (void *)0x0) {
    ImGui::MemFree(pvStack_3f8);
  }
  if (pvStack_490 != (void *)0x0) {
    ImGui::MemFree(pvStack_490);
  }
  return (bool)(bVar64 & 1);
LAB_00137e62:
  __function = "T &ImVector<ImFontBuildDstData>::operator[](int) [T = ImFontBuildDstData]";
  goto LAB_00137de4;
LAB_00137e4b:
  __function = "T &ImVector<ImFontConfig>::operator[](int) [T = ImFontConfig]";
  goto LAB_00137de4;
LAB_00137dcf:
  __function = "T &ImVector<int>::operator[](int) [T = int]";
LAB_00137de4:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                ,0x68b,__function);
}

Assistant:

bool    ImFontAtlas::Build()
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");

    // Select builder
    // - Note that we do not reassign to atlas->FontBuilderIO, since it is likely to point to static data which
    //   may mess with some hot-reloading schemes. If you need to assign to this (for dynamic selection) AND are
    //   using a hot-reloading scheme that messes up static data, store your own instance of ImFontBuilderIO somewhere
    //   and point to it instead of pointing directly to return value of the GetBuilderXXX functions.
    const ImFontBuilderIO* builder_io = FontBuilderIO;
    if (builder_io == NULL)
    {
#ifdef IMGUI_ENABLE_FREETYPE
        builder_io = ImGuiFreeType::GetBuilderForFreeType();
#elif defined(IMGUI_ENABLE_STB_TRUETYPE)
        builder_io = ImFontAtlasGetBuilderForStbTruetype();
#else
        IM_ASSERT(0); // Invalid Build function
#endif
    }

    // Build
    return builder_io->FontBuilder_Build(this);
}